

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gest_trainer.cpp
# Opt level: O3

bool __thiscall
Am_Gesture_Trainer::Add_Example
          (Am_Gesture_Trainer *this,Am_String *classname,Am_Feature_Vector *fv,bool unique)

{
  Gesture_Class *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_Gesture_Trainer_Data *this_01;
  Am_Wrapper *value;
  Am_String AStack_28;
  
  this_01 = this->data;
  if (this_01 == (Am_Gesture_Trainer_Data *)0x0) {
    this_01 = (Am_Gesture_Trainer_Data *)operator_new(0x30);
    Am_Gesture_Trainer_Data::Am_Gesture_Trainer_Data(this_01);
  }
  else {
    if (!unique) goto LAB_001a69fa;
    iVar2 = (*(this_01->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])
                      (this_01);
    this_01 = (Am_Gesture_Trainer_Data *)CONCAT44(extraout_var,iVar2);
  }
  this->data = this_01;
LAB_001a69fa:
  Am_String::Am_String(&AStack_28,classname);
  this_00 = this_01->head;
  while( true ) {
    if (this_00 == (Gesture_Class *)0x0) {
      Am_String::~Am_String(&AStack_28);
      return false;
    }
    bVar1 = Am_String::operator==(&this_00->name,&AStack_28);
    if (bVar1) break;
    this_00 = this_00->next;
  }
  Am_String::~Am_String(&AStack_28);
  value = Am_Feature_Vector::operator_cast_to_Am_Wrapper_(fv);
  Am_Value_List::Add(&this_00->examples,value,Am_TAIL,true);
  Am_Gesture_Classifier::operator=(&this->data->cached_classifier,(Am_Gesture_Classifier_Data *)0x0)
  ;
  return true;
}

Assistant:

bool
Am_Gesture_Trainer::Add_Example(Am_String classname, Am_Feature_Vector fv,
                                bool unique)
{
  if (!data)
    data = new Am_Gesture_Trainer_Data();
  else if (unique)
    data = (Am_Gesture_Trainer_Data *)data->Make_Unique();

  Am_Gesture_Trainer_Data::Gesture_Class *c = data->Find_Class(classname);
  if (!c)
    return false;

  c->examples.Add(fv);

  data->cached_classifier = nullptr;
  return true;
}